

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.cpp
# Opt level: O2

void __thiscall itis::SplayTree::Clear(SplayTree *this,Node *x)

{
  Node *pNVar1;
  Node *pNVar2;
  
  while( true ) {
    pNVar2 = x;
    if (pNVar2 == (Node *)0x0) {
      return;
    }
    x = pNVar2->left_child;
    pNVar1 = pNVar2->right_child;
    if (x == (Node *)0x0) break;
    if (pNVar1 == (Node *)0x0) {
LAB_0010345d:
      Clear(this,x);
LAB_00103462:
      operator_delete(pNVar2,0x20);
      return;
    }
  }
  x = pNVar1;
  if (pNVar1 == (Node *)0x0) goto LAB_00103462;
  goto LAB_0010345d;
}

Assistant:

void SplayTree::Clear(Node *x) {
    if (x != nullptr) {
      if (x->left_child != nullptr || x->right_child != nullptr) {
        if (x->left_child != nullptr && x->right_child == nullptr) {
          Clear(x->left_child);
          delete x;
        } else if (x->left_child == nullptr && x->right_child != nullptr) {
          Clear(x->right_child);
          delete x;
        } else {
          Clear(x->left_child);
        }
      } else {
        delete x;
      }
    }
  }